

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatmain.c
# Opt level: O0

uint16 ecx_siiSMnext(ecx_contextt *context,uint16 slave,ec_eepromSMt *SM,uint16 n)

{
  uint8 uVar1;
  bool bVar2;
  byte bVar3;
  uint8 uVar4;
  uint16 address;
  ushort local_26;
  uint8 eectl;
  uint16 retVal;
  uint16 a;
  uint16 n_local;
  ec_eepromSMt *SM_local;
  uint16 slave_local;
  ecx_contextt *context_local;
  
  uVar1 = context->slavelist[slave].eep_pdi;
  bVar2 = n < SM->nSM;
  if (bVar2) {
    address = SM->Startpos + 2 + n * 8;
    bVar3 = ecx_siigetbyte(context,slave,address);
    SM->PhStart = (ushort)bVar3;
    bVar3 = ecx_siigetbyte(context,slave,address + 1);
    SM->PhStart = SM->PhStart + (ushort)bVar3 * 0x100;
    bVar3 = ecx_siigetbyte(context,slave,address + 2);
    SM->Plength = (ushort)bVar3;
    bVar3 = ecx_siigetbyte(context,slave,address + 3);
    SM->Plength = SM->Plength + (ushort)bVar3 * 0x100;
    uVar4 = ecx_siigetbyte(context,slave,address + 4);
    SM->Creg = uVar4;
    uVar4 = ecx_siigetbyte(context,slave,address + 5);
    SM->Sreg = uVar4;
    uVar4 = ecx_siigetbyte(context,slave,address + 6);
    SM->Activate = uVar4;
    uVar4 = ecx_siigetbyte(context,slave,address + 7);
    SM->PDIctrl = uVar4;
  }
  local_26 = (ushort)bVar2;
  if (uVar1 != '\0') {
    ecx_eeprom2pdi(context,slave);
  }
  return local_26;
}

Assistant:

uint16 ecx_siiSMnext(ecx_contextt *context, uint16 slave, ec_eepromSMt* SM, uint16 n)
{
   uint16 a;
   uint16 retVal = 0;
   uint8 eectl = context->slavelist[slave].eep_pdi;

   if (n < SM->nSM)
   {
      a = SM->Startpos + 2 + (n * 8);
      SM->PhStart = ecx_siigetbyte(context, slave, a++);
      SM->PhStart += (ecx_siigetbyte(context, slave, a++) << 8);
      SM->Plength = ecx_siigetbyte(context, slave, a++);
      SM->Plength += (ecx_siigetbyte(context, slave, a++) << 8);
      SM->Creg = ecx_siigetbyte(context, slave, a++);
      SM->Sreg = ecx_siigetbyte(context, slave, a++);
      SM->Activate = ecx_siigetbyte(context, slave, a++);
      SM->PDIctrl = ecx_siigetbyte(context, slave, a++);
      retVal = 1;
   }
   if (eectl)
   {
      ecx_eeprom2pdi(context, slave); /* if eeprom control was previously pdi then restore */
   }

   return retVal;
}